

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O3

void __thiscall
soplex::ClassSet<soplex::SVSetBase<double>::DLPSV>::~ClassSet
          (ClassSet<soplex::SVSetBase<double>::DLPSV> *this)

{
  if (this->theitem != (Item *)0x0) {
    free(this->theitem);
    this->theitem = (Item *)0x0;
  }
  if (this->thekey != (DataKey *)0x0) {
    free(this->thekey);
    this->thekey = (DataKey *)0x0;
  }
  return;
}

Assistant:

~ClassSet()
   {
      if(theitem)
         spx_free(theitem);

      if(thekey)
         spx_free(thekey);
   }